

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flatbuffer_builder.h
# Opt level: O0

void __thiscall
flatbuffers::FlatBufferBuilderImpl<false>::Swap
          (FlatBufferBuilderImpl<false> *this,FlatBufferBuilderImpl<false> *other)

{
  FlatBufferBuilderImpl<false> *other_local;
  FlatBufferBuilderImpl<false> *this_local;
  
  vector_downward<unsigned_int>::swap(&this->buf_,&other->buf_);
  std::swap<unsigned_int>(&this->num_field_loc,&other->num_field_loc);
  std::swap<unsigned_short>(&this->max_voffset_,&other->max_voffset_);
  std::swap<unsigned_long>(&this->length_of_64_bit_region_,&other->length_of_64_bit_region_);
  std::swap<bool>(&this->nested,&other->nested);
  std::swap<bool>(&this->finished,&other->finished);
  std::swap<unsigned_long>(&this->minalign_,&other->minalign_);
  std::swap<bool>(&this->force_defaults_,&other->force_defaults_);
  std::swap<bool>(&this->dedup_vtables_,&other->dedup_vtables_);
  std::
  swap<std::set<flatbuffers::Offset<flatbuffers::String>,flatbuffers::FlatBufferBuilderImpl<false>::StringOffsetCompare,std::allocator<flatbuffers::Offset<flatbuffers::String>>>*>
            (&this->string_pool,&other->string_pool);
  return;
}

Assistant:

void Swap(FlatBufferBuilderImpl &other) {
    using std::swap;
    buf_.swap(other.buf_);
    swap(num_field_loc, other.num_field_loc);
    swap(max_voffset_, other.max_voffset_);
    swap(length_of_64_bit_region_, other.length_of_64_bit_region_);
    swap(nested, other.nested);
    swap(finished, other.finished);
    swap(minalign_, other.minalign_);
    swap(force_defaults_, other.force_defaults_);
    swap(dedup_vtables_, other.dedup_vtables_);
    swap(string_pool, other.string_pool);
  }